

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_complex_sub(sexp ctx,sexp a,sexp b)

{
  sexp psVar1;
  sexp psVar2;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict local_50;
  sexp_gc_var_t local_48;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_48.var = &local_50;
  local_50 = (sexp_conflict)0x43e;
  local_28.next = &local_48;
  local_28.var = &local_30;
  local_30 = (sexp)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_28.next;
  (ctx->value).context.saves = &local_28;
  local_30 = sexp_complex_copy(ctx,b);
  psVar2 = (local_30->value).type.name;
  if (((ulong)psVar2 & 3) == 0) {
    if (psVar2->tag == 0xd) {
      psVar1 = (psVar2->value).type.name;
      if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0xc)) {
        (psVar1->value).flonum_bits[0] = -(psVar1->value).flonum_bits[0];
      }
      else if (((ulong)psVar1 & 1) != 0) {
        (psVar2->value).type.name = (sexp)(1 - ((ulong)psVar1 & 0xfffffffffffffffe));
      }
    }
    else {
      if (((ulong)psVar2 & 3) != 0) goto LAB_0011d42c;
      if (psVar2->tag == 0xb) {
        (psVar2->value).stack.length = (psVar2->value).stack.length ^ 0x8000000000000000;
      }
      else {
        if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0xc)) goto LAB_0011d42c;
        (psVar2->value).flonum_bits[0] = -(psVar2->value).flonum_bits[0];
      }
    }
  }
  else {
LAB_0011d42c:
    if (((ulong)psVar2 & 1) != 0) {
      (local_30->value).type.name = (sexp)(1 - ((ulong)psVar2 & 0xfffffffffffffffe));
    }
  }
  psVar2 = (local_30->value).type.cpl;
  if (((ulong)psVar2 & 3) == 0) {
    if (psVar2->tag == 0xd) {
      psVar1 = (psVar2->value).type.name;
      if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0xc)) {
        (psVar1->value).flonum_bits[0] = -(psVar1->value).flonum_bits[0];
      }
      else if (((ulong)psVar1 & 1) != 0) {
        (psVar2->value).type.name = (sexp)(1 - ((ulong)psVar1 & 0xfffffffffffffffe));
      }
      goto LAB_0011d45f;
    }
    if (((ulong)psVar2 & 3) == 0) {
      if (psVar2->tag == 0xb) {
        (psVar2->value).stack.length = (psVar2->value).stack.length ^ 0x8000000000000000;
        goto LAB_0011d45f;
      }
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0xc)) {
        (psVar2->value).flonum_bits[0] = -(psVar2->value).flonum_bits[0];
        goto LAB_0011d45f;
      }
    }
  }
  if (((ulong)psVar2 & 1) != 0) {
    (local_30->value).type.cpl = (sexp)(1 - ((ulong)psVar2 & 0xfffffffffffffffe));
  }
LAB_0011d45f:
  psVar2 = sexp_complex_add(ctx,a,local_30);
  (ctx->value).context.saves = local_48.next;
  return psVar2;
}

Assistant:

sexp sexp_complex_sub (sexp ctx, sexp a, sexp b) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  tmp = sexp_complex_copy(ctx, b);
  sexp_negate_maybe_ratio(sexp_complex_real(tmp));
  sexp_negate_maybe_ratio(sexp_complex_imag(tmp));
  res = sexp_complex_add(ctx, a, tmp);
  sexp_gc_release2(ctx);
  return res;
}